

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O3

void __thiscall CLOptions::CLOptions(CLOptions *this)

{
  allocator local_52;
  allocator local_51;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
  *local_50;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
  *local_48;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
  *local_40;
  vector<option,_std::allocator<option>_> *local_38;
  
  this->_vptr_CLOptions = (_func_int **)&PTR__CLOptions_00166548;
  local_38 = &this->longopts;
  std::vector<option,_std::allocator<option>_>::vector(local_38);
  local_40 = &this->params_bools;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
  ::map(local_40);
  local_48 = &this->params_doubles;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
  ::map(local_48);
  local_50 = &this->params_ints;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
  ::map(local_50);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
  ::map(&this->params_strings);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->help_str,"help",&local_51);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->version_str,"version",&local_52);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_52);
  std::__cxx11::string::string((string *)&this->configfile_opt_name);
  std::__cxx11::string::string((string *)&this->configfile_comment);
  CLString::CLString(&this->version_opt);
  std::__cxx11::string::string((string *)&this->program_desc_);
  return;
}

Assistant:

CLOptions() {}